

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::WrapperOneofFieldGenerator::GenerateSerializedSizeCode
          (WrapperOneofFieldGenerator *this,Printer *printer)

{
  google::protobuf::io::Printer::Print
            ((map *)printer,
             (char *)&(this->super_WrapperFieldGenerator).super_FieldGeneratorBase.variables_);
  return;
}

Assistant:

void WrapperOneofFieldGenerator::GenerateSerializedSizeCode(io::Printer* printer) {
  // TODO: I suspect this is wrong...
  printer->Print(
    variables_,
    "if ($has_property_check$) {\n"
    "  size += _oneof_$name$_codec.CalculateSizeWithTag($property_name$);\n"
    "}\n");
}